

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O0

void __thiscall
HdlcAnalyzerResults::GenInformationFieldString
          (HdlcAnalyzerResults *this,Frame *frame,DisplayBase display_base,bool tabular)

{
  undefined1 local_c8 [8];
  string escStr;
  char local_a8 [8];
  char numberStr [64];
  char informationStr [64];
  bool tabular_local;
  DisplayBase display_base_local;
  Frame *frame_local;
  HdlcAnalyzerResults *this_local;
  
  AnalyzerHelpers::GetNumberString
            (*(ulonglong *)(frame + 0x10),display_base,8,numberStr + 0x38,0x40);
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x18),Decimal,0x20,local_a8,0x40);
  GenEscapedString_abi_cxx11_((HdlcAnalyzerResults *)local_c8,(Frame *)this);
  if (tabular) {
    std::__cxx11::string::c_str();
    AnalyzerResults::AddTabularText((char *)this,"Info ",local_a8," [",numberStr + 0x38,"]");
  }
  else {
    AnalyzerResults::AddResultString
              ((char *)this,"I",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"I ",local_a8,(char *)0x0,(char *)0x0,(char *)0x0)
    ;
    std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString((char *)this,"I ",local_a8," [",numberStr + 0x38,"]");
    std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString((char *)this,"Info ",local_a8," [",numberStr + 0x38,"]");
  }
  std::__cxx11::string::~string((string *)local_c8);
  return;
}

Assistant:

void HdlcAnalyzerResults::GenInformationFieldString( const Frame& frame, const DisplayBase display_base, bool tabular )
{
    char informationStr[ 64 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, informationStr, 64 );
    char numberStr[ 64 ];
    AnalyzerHelpers::GetNumberString( frame.mData2, Decimal, 32, numberStr, 64 );

    string escStr = GenEscapedString( frame );

    if( !tabular )
    {
        AddResultString( "I" );
        AddResultString( "I ", numberStr );
        AddResultString( "I ", numberStr, " [", informationStr, "]", escStr.c_str() );
        AddResultString( "Info ", numberStr, " [", informationStr, "]", escStr.c_str() );
    }
    else
        AddTabularText( "Info ", numberStr, " [", informationStr, "]", escStr.c_str() );
}